

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

ON_SHA1_Hash * __thiscall
ON_Annotation::Internal_GetBBox_InputHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_Annotation *this,ON_Viewport *vp,
          ON_DimStyle *dimstyle,double dimscale,ON_2dPoint *text_point,uint point_count,
          ON_2dPoint *points)

{
  bool bVar1;
  ON_SHA1_Hash *sub_hash;
  double x;
  ON_SHA1 sha1;
  ON_BoundingBox textbbox;
  
  ON_SHA1::ON_SHA1(&sha1);
  if (vp != (ON_Viewport *)0x0) {
    ON_Viewport::ViewProjectionContentHash((ON_SHA1_Hash *)&textbbox,vp);
    ON_SHA1::AccumulateSubHash(&sha1,(ON_SHA1_Hash *)&textbbox);
  }
  if (dimstyle != (ON_DimStyle *)0x0) {
    sub_hash = ON_DimStyle::ContentHash(dimstyle);
    ON_SHA1::AccumulateSubHash(&sha1,sub_hash);
  }
  ON_SHA1::AccumulateDouble(&sha1,dimscale);
  ON_SHA1::Accumulate3dVector(&sha1,&(this->m_plane).xaxis);
  ON_SHA1::Accumulate3dVector(&sha1,&(this->m_plane).yaxis);
  ON_SHA1::Accumulate3dVector(&sha1,&(this->m_plane).zaxis);
  ON_SHA1::AccumulateDoubleArray(&sha1,4,&(this->m_plane).plane_equation.x);
  if (this->m_text != (ON_TextContent *)0x0) {
    ON_Geometry::BoundingBox(&textbbox,&this->m_text->super_ON_Geometry);
    ON_SHA1::AccumulateBoundingBox(&sha1,&textbbox);
    bVar1 = ON_BoundingBox::IsNotEmpty(&textbbox);
    if (bVar1) {
      bVar1 = DimstyleHasMask(dimstyle);
      if (bVar1) {
        x = ON_DimStyle::MaskBorder(dimstyle);
        ON_SHA1::AccumulateDouble(&sha1,x);
      }
    }
  }
  ON_SHA1::Accumulate2dPoint(&sha1,text_point);
  ON_SHA1::AccumulateUnsigned32(&sha1,point_count);
  if (points != (ON_2dPoint *)0x0 && point_count != 0) {
    ON_SHA1::AccumulateDoubleArray(&sha1,(ulong)(point_count * 2),&points->x);
  }
  ON_SHA1::Hash(__return_storage_ptr__,&sha1);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_Annotation::Internal_GetBBox_InputHash(
  const ON_Viewport* vp,
  const ON_DimStyle* dimstyle,
  double dimscale,
  const ON_2dPoint& text_point,
  unsigned int point_count,
  const ON_2dPoint* points
) const
{
  ON_SHA1 sha1;
  if (nullptr != vp)
    sha1.AccumulateSubHash(vp->ViewProjectionContentHash());
  if ( nullptr != dimstyle )
    sha1.AccumulateSubHash(dimstyle->ContentHash());
  sha1.AccumulateDouble(dimscale);
  
  sha1.Accumulate3dVector(m_plane.xaxis);
  sha1.Accumulate3dVector(m_plane.yaxis);
  sha1.Accumulate3dVector(m_plane.zaxis);
  sha1.AccumulateDoubleArray(4,&m_plane.plane_equation.x);

  if (nullptr != m_text)
  {
    // This return ON_TextContent.m_mbox
    // which is a cached value
    const ON_BoundingBox textbbox = m_text->BoundingBox();
    sha1.AccumulateBoundingBox(textbbox);
    if (textbbox.IsNotEmpty() && DimstyleHasMask(dimstyle))
    {
      sha1.AccumulateDouble(dimstyle->MaskBorder());
    }
  }

  sha1.Accumulate2dPoint(text_point);
  sha1.AccumulateUnsigned32(point_count);
  if (point_count > 0 && nullptr != points)
    sha1.AccumulateDoubleArray(2 * point_count, &points[0].x);

  return sha1.Hash();
}